

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptlinux.c
# Opt level: O3

void * Pt_CallbackProc(void *p)

{
  code *pcVar1;
  __uid_t _Var2;
  int iVar3;
  int iVar4;
  timeb now;
  timeval timeout;
  int local_50 [2];
  ushort local_48;
  timeval local_40;
  
  _Var2 = geteuid();
  if (_Var2 == 0) {
    setpriority(PRIO_PROCESS,0,-0x14);
  }
  if (pt_callback_proc_id == *p) {
    iVar4 = 1;
    do {
      iVar3 = *(int *)((long)p + 4);
      ftime();
      iVar3 = ((local_50[0] - (int)time_offset.time) * -1000 - (uint)local_48) +
              (uint)time_offset.millitm + iVar4 * iVar3;
      if (iVar3 < 1) {
        iVar3 = 0;
      }
      local_40.tv_sec = 0;
      local_40.tv_usec = (__suseconds_t)(uint)(iVar3 * 1000);
      select(0,(fd_set *)0x0,(fd_set *)0x0,(fd_set *)0x0,&local_40);
      pcVar1 = *(code **)((long)p + 8);
      ftime(local_50);
      (*pcVar1)(((local_50[0] - (int)time_offset.time) * 1000 + (uint)local_48) -
                (uint)time_offset.millitm);
      iVar4 = iVar4 + 1;
    } while (pt_callback_proc_id == *p);
  }
  return (void *)0x0;
}

Assistant:

static void *Pt_CallbackProc(void *p)
{
    pt_callback_parameters *parameters = (pt_callback_parameters *) p;
    int mytime = 1;
    /* to kill a process, just increment the pt_callback_proc_id */
    /* printf("pt_callback_proc_id %d, id %d\n", pt_callback_proc_id,
           parameters->id); */
    if (geteuid() == 0) setpriority(PRIO_PROCESS, 0, -20);
    while (pt_callback_proc_id == parameters->id) {
        /* wait for a multiple of resolution ms */
        struct timeval timeout;
        int delay = mytime++ * parameters->resolution - Pt_Time();
        if (delay < 0) delay = 0;
        timeout.tv_sec = 0;
        timeout.tv_usec = delay * 1000;
        select(0, NULL, NULL, NULL, &timeout);
        (*(parameters->callback))(Pt_Time(), parameters->userData);
    }
    /* printf("Pt_CallbackProc exiting\n"); */
    // free(parameters);
    return NULL;
}